

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_shr_slow(JSContext *ctx,JSValue *sp)

{
  JSValue val;
  JSValue v;
  int iVar1;
  undefined8 in_RAX;
  double dVar2;
  int64_t iVar3;
  uint32_t v2;
  uint32_t v1;
  undefined8 local_28;
  
  v = sp[-1];
  val = sp[-1];
  local_28 = in_RAX;
  iVar1 = JS_ToInt32Free(ctx,(int32_t *)((long)&local_28 + 4),sp[-2]);
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32Free(ctx,(int32_t *)&local_28,val);
    if (iVar1 == 0) {
      local_28._4_4_ = local_28._4_4_ >> ((byte)local_28 & 0x1f);
      dVar2 = (double)local_28._4_4_;
      if (-1 < (int)local_28._4_4_) {
        dVar2 = (double)(ulong)local_28._4_4_;
      }
      iVar3 = 7;
      if (-1 < (int)local_28._4_4_) {
        iVar3 = 0;
      }
      sp[-2].u.float64 = dVar2;
      sp[-2].tag = iVar3;
      return 0;
    }
  }
  else {
    JS_FreeValue(ctx,v);
  }
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

static no_inline int js_shr_slow(JSContext *ctx, JSValue *sp)
{
    JSValue op1, op2;
    uint32_t v1, v2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToUint32Free(ctx, &v1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToUint32Free(ctx, &v2, op2)))
        goto exception;
    r = v1 >> (v2 & 0x1f);
    sp[-2] = JS_NewUint32(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}